

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O1

void cf_hash_drbg_sha256_reseed
               (cf_hash_drbg_sha256 *ctx,void *entropy,size_t nentropy,void *addnl,size_t naddnl)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint8_t zero;
  uint8_t one;
  uint8_t *in_stack_ffffffffffffffe0;
  uint6 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffee;
  undefined1 uVar6;
  
  uVar6 = 1;
  *(undefined8 *)(ctx->C + 0x2f) = *(undefined8 *)(ctx->V + 0x2f);
  uVar1 = *(undefined8 *)ctx->V;
  uVar2 = *(undefined8 *)(ctx->V + 8);
  uVar3 = *(undefined8 *)(ctx->V + 0x10);
  uVar4 = *(undefined8 *)(ctx->V + 0x18);
  uVar5 = *(undefined8 *)(ctx->V + 0x28);
  *(undefined8 *)(ctx->C + 0x20) = *(undefined8 *)(ctx->V + 0x20);
  *(undefined8 *)(ctx->C + 0x28) = uVar5;
  *(undefined8 *)(ctx->C + 0x10) = uVar3;
  *(undefined8 *)(ctx->C + 0x18) = uVar4;
  *(undefined8 *)ctx->C = uVar1;
  *(undefined8 *)(ctx->C + 8) = uVar2;
  hash_df((cf_chash *)&stack0xffffffffffffffef,(void *)0x1,(size_t)ctx->C,(void *)0x37,
          (size_t)entropy,(void *)nentropy,(size_t)addnl,(void *)naddnl,(size_t)ctx,
          in_stack_ffffffffffffffe0,
          CONCAT17(1,CONCAT16(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8)));
  hash_df((cf_chash *)&stack0xffffffffffffffee,(void *)0x1,(size_t)ctx,(void *)0x37,0,(void *)0x0,0,
          (void *)0x0,(size_t)ctx->C,in_stack_ffffffffffffffe0,
          CONCAT17(uVar6,(uint7)in_stack_ffffffffffffffe8));
  ctx->reseed_counter = 1;
  return;
}

Assistant:

void cf_hash_drbg_sha256_reseed(cf_hash_drbg_sha256 *ctx,
                                const void *entropy, size_t nentropy,
                                const void *addnl, size_t naddnl)
{
  /* 1. seed_material = 0x01 || V || entropy_input || additional_input
   * 2. seed = Hash_df(seed_material, seedlen)
   * 3. V = seed */
  uint8_t one = 1;
  /* stash V in C, because it cannot alias output */
  memcpy(ctx->C, ctx->V, sizeof ctx->C);
  hash_df(&cf_sha256,
          &one, sizeof one,
          ctx->C, sizeof ctx->C,
          entropy, nentropy,
          addnl, naddnl,
          ctx->V, sizeof ctx->V);

  /* 4. C = Hash_df(0x00 || V, seedlen) */
  uint8_t zero = 0;
  hash_df(&cf_sha256,
          &zero, sizeof zero,
          ctx->V, sizeof ctx->V,
          NULL, 0,
          NULL, 0,
          ctx->C, sizeof ctx->C);

  /* 5. reseed_counter = 1 */
  ctx->reseed_counter = 1;
}